

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O3

void gen_codes(ct_data *tree,int max_code,uint16_t *bl_count)

{
  ushort uVar1;
  int bits;
  long lVar2;
  ushort uVar3;
  ulong uVar4;
  ushort auStack_38 [8];
  uint16_t next_code [16];
  
  lVar2 = 1;
  uVar3 = 0;
  do {
    uVar3 = (uVar3 + bl_count[lVar2 + -1]) * 2;
    auStack_38[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  if (-1 < max_code) {
    uVar4 = 0;
    do {
      uVar3 = tree[uVar4].dl.dad;
      if (uVar3 != 0) {
        uVar1 = auStack_38[uVar3];
        auStack_38[uVar3] = uVar1 + 1;
        tree[uVar4].fc.freq =
             (uint16_t)
             (((uint)(((ulong)(uVar1 & 0xff) * 0x80200802 & 0x884422110) * 0x101010101 >> 0x18) &
               0xff00 | (uint)(((ulong)(uVar1 >> 8) * 0x80200802 & 0x884422110) * 0x101010101 >>
                              0x20) & 0xff) >> (0x10U - (char)uVar3 & 0x1f));
      }
      uVar4 = uVar4 + 1;
    } while (max_code + 1 != uVar4);
  }
  return;
}

Assistant:

Z_INTERNAL void gen_codes(ct_data *tree, int max_code, uint16_t *bl_count) {
    /* tree: the tree to decorate */
    /* max_code: largest code with non zero frequency */
    /* bl_count: number of codes at each bit length */
    uint16_t next_code[MAX_BITS+1];  /* next code value for each bit length */
    unsigned int code = 0;           /* running code value */
    int bits;                        /* bit index */
    int n;                           /* code index */

    /* The distribution counts are first used to generate the code values
     * without bit reversal.
     */
    for (bits = 1; bits <= MAX_BITS; bits++) {
        code = (code + bl_count[bits-1]) << 1;
        next_code[bits] = (uint16_t)code;
    }
    /* Check that the bit counts in bl_count are consistent. The last code
     * must be all ones.
     */
    Assert(code + bl_count[MAX_BITS]-1 == (1 << MAX_BITS)-1, "inconsistent bit counts");
    Tracev((stderr, "\ngen_codes: max_code %d ", max_code));

    for (n = 0;  n <= max_code; n++) {
        int len = tree[n].Len;
        if (len == 0)
            continue;
        /* Now reverse the bits */
        tree[n].Code = PREFIX(bi_reverse)(next_code[len]++, len);

        Tracecv(tree != static_ltree, (stderr, "\nn %3d %c l %2d c %4x (%x) ",
             n, (isgraph(n & 0xff) ? n : ' '), len, tree[n].Code, next_code[len]-1));
    }
}